

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O0

bool __thiscall GetNameTest::DoTest(GetNameTest *this)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  DnsStats *this_00;
  size_t next;
  size_t name_length;
  char name_out [1024];
  ulong local_20;
  size_t i;
  bool ret;
  GetNameTest *this_local;
  
  pFVar2 = ithi_file_open(getname_test_debug,"w");
  this->test_out = pFVar2;
  i._7_1_ = this->test_out != (FILE *)0x0;
  for (local_20 = 0; i._7_1_ != false && local_20 < 9; local_20 = local_20 + 1) {
    next = 0;
    iVar1 = DnsStats::GetDnsName
                      (getNameTestData[local_20].dns,(uint32_t)getNameTestData[local_20].dns_length,
                       0,(uint8_t *)&name_length,0x400,&next);
    if ((long)iVar1 == getNameTestData[local_20].dns_length) {
      sVar3 = strlen(getNameTestData[local_20].expected);
      if (sVar3 == next) {
        iVar1 = memcmp(getNameTestData[local_20].expected,&name_length,next);
        if (iVar1 != 0) {
          i._7_1_ = false;
        }
      }
      else {
        i._7_1_ = false;
      }
    }
    else {
      i._7_1_ = false;
    }
  }
  if (i._7_1_ != false) {
    this_00 = (DnsStats *)operator_new(0x1e0);
    DnsStats::DnsStats(this_00);
    this->stats = this_00;
    if (this->stats == (DnsStats *)0x0) {
      i._7_1_ = false;
    }
  }
  if (i._7_1_ != false) {
    i._7_1_ = LoadPcapFile(this,getname_input_test);
  }
  if (this->test_out != (FILE *)0x0) {
    fclose((FILE *)this->test_out);
    this->test_out = (FILE *)0x0;
  }
  if (i._7_1_ != false) {
    i._7_1_ = MetricTest::compare_files(getname_test_debug,getname_test_output);
  }
  return i._7_1_;
}

Assistant:

bool GetNameTest::DoTest()
{
    bool ret = true;

    test_out = ithi_file_open(getname_test_debug, "w");
    ret = (test_out != NULL);

    for (size_t i = 0; ret && i < sizeof(getNameTestData) / sizeof(struct st_getNameTestLine); i++) {
        char name_out[1024];
        size_t name_length = 0;
        size_t next = 0;

        next = DnsStats::GetDnsName(getNameTestData[i].dns, (uint32_t)getNameTestData[i].dns_length, 0, (uint8_t *)name_out, sizeof(name_out), &name_length);

        if (next != getNameTestData[i].dns_length) {
            ret = false;
        } else  if (strlen(getNameTestData[i].expected) != name_length) {
            ret = false;
        } else if (memcmp(getNameTestData[i].expected, name_out, name_length) != 0) {
            ret = false;
        }
    }


    if (ret) {
        stats = new DnsStats();

        if (stats == NULL) {
            ret = false;
        }
    }

    if (ret) {
        ret = LoadPcapFile(getname_input_test);
    }

    if (test_out != NULL) {
        fclose(test_out);
        test_out = NULL;
    }

    if (ret) {
        ret = MetricTest::compare_files(getname_test_debug, getname_test_output);
    }

    return ret;
}